

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

void __thiscall vkb::Result<vkb::PhysicalDevice>::destroy(Result<vkb::PhysicalDevice> *this)

{
  Result<vkb::PhysicalDevice> *this_local;
  
  if ((this->m_init & 1U) != 0) {
    PhysicalDevice::~PhysicalDevice((PhysicalDevice *)this);
  }
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }